

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_bool32 ma_dr_wav_init_file_write__internal_FILE
                    (ma_dr_wav *pWav,FILE *pFile,ma_dr_wav_data_format *pFormat,
                    ma_uint64 totalSampleCount,ma_bool32 isSequential,
                    ma_allocation_callbacks *pAllocationCallbacks)

{
  ma_bool32 mVar1;
  ma_dr_wav_seek_proc in_RCX;
  ma_dr_wav_write_proc in_RDX;
  FILE *in_RSI;
  ma_dr_wav_data_format *in_RDI;
  undefined4 in_R8D;
  ma_dr_wav_data_format *unaff_retaddr;
  ma_dr_wav *in_stack_00000008;
  ma_bool32 result;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  mVar1 = ma_dr_wav_preinit_write
                    ((ma_dr_wav *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                     in_RDI,(ma_bool32)((ulong)in_RSI >> 0x20),in_RDX,in_RCX,
                     (void *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),pAllocationCallbacks);
  if (mVar1 == 1) {
    mVar1 = ma_dr_wav_init_write__internal
                      (in_stack_00000008,unaff_retaddr,
                       CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    if (mVar1 == 1) {
      mVar1 = 1;
    }
    else {
      fclose(in_RSI);
    }
  }
  else {
    fclose(in_RSI);
  }
  return mVar1;
}

Assistant:

MA_PRIVATE ma_bool32 ma_dr_wav_init_file_write__internal_FILE(ma_dr_wav* pWav, FILE* pFile, const ma_dr_wav_data_format* pFormat, ma_uint64 totalSampleCount, ma_bool32 isSequential, const ma_allocation_callbacks* pAllocationCallbacks)
{
    ma_bool32 result;
    result = ma_dr_wav_preinit_write(pWav, pFormat, isSequential, ma_dr_wav__on_write_stdio, ma_dr_wav__on_seek_stdio, (void*)pFile, pAllocationCallbacks);
    if (result != MA_TRUE) {
        fclose(pFile);
        return result;
    }
    result = ma_dr_wav_init_write__internal(pWav, pFormat, totalSampleCount);
    if (result != MA_TRUE) {
        fclose(pFile);
        return result;
    }
    return MA_TRUE;
}